

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O2

void Gia_ManTestDoms(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  Vec_Int_t *p_00;
  int v;
  
  Gia_ManCleanMark1(p);
  for (v = 0; v < p->vCis->nSize - p->nRegs; v = v + 1) {
    pGVar1 = Gia_ManCi(p,v);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    pGVar1->field_0x7 = pGVar1->field_0x7 | 0x40;
  }
  if (p->vDoms == (Vec_Int_t *)0x0) {
    p_00 = Gia_ManComputePiDoms(p);
    Vec_IntFree(p_00);
    Gia_ManCleanMark1(p);
    return;
  }
  __assert_fail("p->vDoms == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                ,0x127,"void Gia_ManTestDoms(Gia_Man_t *)");
}

Assistant:

void Gia_ManTestDoms( Gia_Man_t * p )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i;
    // mark PIs
//    Gia_ManCreateRefs( p );
    Gia_ManCleanMark1( p );
    Gia_ManForEachPi( p, pObj, i )
        pObj->fMark1 = 1;
    // compute dominators
    assert( p->vDoms == NULL );
    vNodes = Gia_ManComputePiDoms( p );
//    printf( "Nodes = %d. Doms = %d.\n", Gia_ManAndNum(p), Vec_IntSize(vNodes) );
    Vec_IntFree( vNodes );
    // unmark PIs
    Gia_ManCleanMark1( p );
}